

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O3

void Ptex::v2_2::anon_unknown_2::ApplyN<unsigned_char>
               (PtexTriangleKernelIter *k,float *result,void *data,int nChan,int nTxChan)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  iVar7 = k->v1;
  iVar2 = k->v2;
  if (iVar7 != iVar2) {
    fVar1 = k->A;
    do {
      iVar5 = k->rowlen - iVar7;
      iVar4 = iVar5 - k->w2;
      if (iVar4 < k->u1) {
        iVar4 = k->u1;
      }
      iVar5 = iVar5 - k->w1;
      if (k->u2 < iVar5) {
        iVar5 = k->u2;
      }
      iVar5 = (iVar5 - iVar4) * nTxChan;
      if (0 < iVar5) {
        uVar8 = (long)((k->rowlen * iVar7 + iVar4) * nTxChan) + (long)data;
        uVar6 = (long)iVar5 + uVar8;
        fVar10 = (float)iVar4 - k->u;
        fVar9 = (float)iVar7 - k->v;
        fVar11 = fVar10 * k->A * fVar10 + (k->B * fVar10 + k->C * fVar9) * fVar9;
        fVar9 = (fVar10 + fVar10 + 1.0) * k->A + fVar9 * k->B;
        do {
          if (fVar11 < 1.0) {
            fVar10 = expf(fVar11 * -6.125);
            fVar10 = fVar10 * k->wscale;
            k->weight = k->weight + fVar10;
            if (0 < nChan) {
              uVar3 = 0;
              do {
                result[uVar3] = (float)*(byte *)(uVar8 + uVar3) * fVar10 + result[uVar3];
                uVar3 = uVar3 + 1;
              } while ((uint)nChan != uVar3);
            }
          }
          fVar11 = fVar11 + fVar9;
          fVar9 = fVar9 + fVar1 + fVar1;
          uVar8 = uVar8 + (long)nTxChan;
        } while (uVar8 < uVar6);
        iVar2 = k->v2;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar2);
  }
  return;
}

Assistant:

void ApplyN(PtexTriangleKernelIter& k, float* result, void* data, int nChan, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccumN<T>()(result, p, nChan, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }